

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_iostream.h
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
operator>>(basic_istream<char,_std::char_traits<char>_> *stream,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> stl_string;
  char *local_38;
  size_t local_30;
  char local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = '\0';
  local_38 = &local_28;
  std::operator>>((istream *)stream,(string *)&local_38);
  ST::string::set(str,local_38,local_30,check_validity);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return stream;
}

Assistant:

std::basic_istream<char_T, traits_T> &operator>>(
        std::basic_istream<char_T, traits_T> &stream ST_LIFETIME_BOUND,
        ST::string &str)
{
    std::basic_string<char_T, traits_T> stl_string;
    stream >> stl_string;
    str.set(stl_string.c_str(), stl_string.size());
    return stream;
}